

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::AtomicCounterCase::iterate(AtomicCounterCase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  GLuint GVar5;
  glUseProgramFunc p_Var6;
  glGetProgramResourceIndexFunc p_Var7;
  glBindBufferFunc p_Var8;
  glBindBufferBaseFunc p_Var9;
  glDispatchComputeFunc p_Var10;
  bool bVar11;
  int iVar12;
  ContextType type;
  GLSLVersion version;
  deUint32 dVar13;
  GLuint GVar14;
  deUint32 dVar15;
  GLenum GVar16;
  RenderContext *pRVar17;
  undefined4 extraout_var;
  int *piVar18;
  char *pcVar19;
  ostream *poVar20;
  ProgramSources *sources;
  TestLog *pTVar21;
  TestError *pTVar22;
  MessageBuilder *pMVar23;
  void *pvVar24;
  GLuint *pGVar25;
  uint b;
  IVec3 *pIVar26;
  allocator<char> local_701;
  string local_700;
  undefined1 local_6d9;
  string local_6d8;
  allocator<char> local_6b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  uint local_650;
  int local_64c;
  deUint32 res;
  int valNdx;
  deUint32 refSum;
  deUint32 valSum;
  BufferMemMap bufMap_1;
  InterfaceVariableInfo valueInfo;
  deUint32 valueIndex;
  int blockSize_1;
  deUint32 blockIndex_1;
  uint local_5a4;
  undefined1 local_5a0 [4];
  deUint32 resVal;
  BufferMemMap bufMap;
  deUint32 bufferSize_1;
  deUint32 bufferIndex_1;
  deUint32 uniformOffset;
  deUint32 uniformIndex_1;
  int blockSize;
  deUint32 blockIndex;
  BufferMemMap memMap;
  deUint32 bufferSize;
  deUint32 bufferIndex;
  deUint32 uniformIndex;
  string local_3c8;
  ShaderSource local_3a8;
  ProgramSources local_380;
  undefined1 local_2b0 [8];
  ShaderProgram program;
  ostringstream src;
  GLSLVersion glslVersion;
  int numValues;
  int workGroupCount;
  int workGroupSize;
  undefined1 local_48 [8];
  Buffer counterBuffer;
  Buffer outputBuffer;
  Functions *gl;
  AtomicCounterCase *this_local;
  Functions *gl_00;
  
  pRVar17 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar12 = (*pRVar17->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar12);
  pRVar17 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&counterBuffer.super_ObjectWrapper.m_object,
             pRVar17);
  pRVar17 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_48,pRVar17);
  pIVar26 = &this->m_localSize;
  piVar18 = tcu::Vector<int,_3>::operator[](pIVar26,0);
  iVar12 = *piVar18;
  piVar18 = tcu::Vector<int,_3>::operator[](pIVar26,1);
  iVar1 = *piVar18;
  piVar18 = tcu::Vector<int,_3>::operator[](pIVar26,2);
  iVar2 = *piVar18;
  pIVar26 = &this->m_workSize;
  piVar18 = tcu::Vector<int,_3>::operator[](pIVar26,0);
  iVar3 = *piVar18;
  piVar18 = tcu::Vector<int,_3>::operator[](pIVar26,1);
  iVar4 = *piVar18;
  piVar18 = tcu::Vector<int,_3>::operator[](pIVar26,2);
  b = iVar12 * iVar1 * iVar2 * iVar3 * iVar4 * *piVar18;
  pRVar17 = Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar17->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program.m_program.m_info.linkTimeUs);
  pcVar19 = glu::getGLSLVersionDeclaration(version);
  poVar20 = std::operator<<((ostream *)&program.m_program.m_info.linkTimeUs,pcVar19);
  poVar20 = std::operator<<(poVar20,"\n");
  poVar20 = std::operator<<(poVar20,"layout (local_size_x = ");
  piVar18 = tcu::Vector<int,_3>::operator[](&this->m_localSize,0);
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,*piVar18);
  poVar20 = std::operator<<(poVar20,", local_size_y = ");
  piVar18 = tcu::Vector<int,_3>::operator[](&this->m_localSize,1);
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,*piVar18);
  poVar20 = std::operator<<(poVar20,", local_size_z = ");
  piVar18 = tcu::Vector<int,_3>::operator[](&this->m_localSize,2);
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,*piVar18);
  poVar20 = std::operator<<(poVar20,") in;\n");
  poVar20 = std::operator<<(poVar20,"layout(binding = 0) buffer Output {\n");
  poVar20 = std::operator<<(poVar20,"    uint values[");
  poVar20 = (ostream *)std::ostream::operator<<(poVar20,b);
  poVar20 = std::operator<<(poVar20,"];\n");
  poVar20 = std::operator<<(poVar20,"} sb_out;\n\n");
  poVar20 = std::operator<<(poVar20,
                            "layout(binding = 0, offset = 0) uniform atomic_uint u_count;\n\n");
  poVar20 = std::operator<<(poVar20,"void main (void) {\n");
  poVar20 = std::operator<<(poVar20,
                            "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                           );
  poVar20 = std::operator<<(poVar20,
                            "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                           );
  poVar20 = std::operator<<(poVar20,"    uint globalOffs = localSize*globalNdx;\n");
  poVar20 = std::operator<<(poVar20,
                            "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
                           );
  poVar20 = std::operator<<(poVar20,"\n");
  poVar20 = std::operator<<(poVar20,"    uint oldVal = atomicCounterIncrement(u_count);\n");
  poVar20 = std::operator<<(poVar20,"    sb_out.values[globalOffs+localOffs] = oldVal;\n");
  std::operator<<(poVar20,"}\n");
  pRVar17 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_380);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_3a8,&local_3c8);
  sources = glu::ProgramSources::operator<<(&local_380,&local_3a8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2b0,pRVar17,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  glu::ProgramSources::~ProgramSources(&local_380);
  pTVar21 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  glu::operator<<(pTVar21,(ShaderProgram *)local_2b0);
  bVar11 = glu::ShaderProgram::isOk((ShaderProgram *)local_2b0);
  if (!bVar11) {
    pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar22,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x5f2);
    __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar21 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)&bufferIndex,pTVar21,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar23 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&bufferIndex,(char (*) [14])"Work groups: ");
  pMVar23 = tcu::MessageBuilder::operator<<(pMVar23,&this->m_workSize);
  tcu::MessageBuilder::operator<<(pMVar23,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&bufferIndex);
  p_Var6 = gl_00->useProgram;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  (*p_Var6)(dVar13);
  p_Var7 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  GVar14 = (*p_Var7)(dVar13,0x92e1,"u_count");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  dVar13 = glu::getProgramResourceUint(gl_00,dVar13,0x92e1,GVar14,0x9301);
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  memMap.m_ptr._4_4_ = glu::getProgramResourceUint(gl_00,dVar15,0x92c0,dVar13,0x9303);
  p_Var8 = gl_00->bindBuffer;
  dVar13 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  (*p_Var8)(0x92c0,dVar13);
  (*gl_00->bufferData)(0x92c0,(ulong)memMap.m_ptr._4_4_,(void *)0x0,0x88e1);
  BufferMemMap::BufferMemMap((BufferMemMap *)&blockSize,gl_00,0x92c0,0,memMap.m_ptr._4_4_,2);
  pvVar24 = BufferMemMap::getPtr((BufferMemMap *)&blockSize);
  deMemset(pvVar24,0,(long)(int)memMap.m_ptr._4_4_);
  BufferMemMap::~BufferMemMap((BufferMemMap *)&blockSize);
  p_Var9 = gl_00->bindBufferBase;
  dVar13 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_48);
  (*p_Var9)(0x92c0,0,dVar13);
  GVar16 = (*gl_00->getError)();
  glu::checkError(GVar16,"Atomic counter buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x607);
  p_Var7 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  GVar14 = (*p_Var7)(dVar13,0x92e6,"Output");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  iVar12 = glu::getProgramResourceInt(gl_00,dVar13,0x92e6,GVar14,0x9303);
  p_Var8 = gl_00->bindBuffer;
  dVar13 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&counterBuffer.super_ObjectWrapper.m_object);
  (*p_Var8)(0x90d2,dVar13);
  (*gl_00->bufferData)(0x90d2,(long)iVar12,(void *)0x0,0x88e1);
  p_Var9 = gl_00->bindBufferBase;
  dVar13 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&counterBuffer.super_ObjectWrapper.m_object);
  (*p_Var9)(0x90d2,0,dVar13);
  GVar16 = (*gl_00->getError)();
  glu::checkError(GVar16,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x612);
  p_Var10 = gl_00->dispatchCompute;
  pIVar26 = &this->m_workSize;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,0);
  GVar14 = *pGVar25;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,1);
  GVar5 = *pGVar25;
  pGVar25 = (GLuint *)tcu::Vector<int,_3>::operator[](pIVar26,2);
  (*p_Var10)(GVar14,GVar5,*pGVar25);
  GVar16 = (*gl_00->getError)();
  glu::checkError(GVar16,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x617);
  p_Var7 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  GVar14 = (*p_Var7)(dVar13,0x92e1,"u_count");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  dVar13 = glu::getProgramResourceUint(gl_00,dVar13,0x92e1,GVar14,0x92fc);
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  bufMap.m_ptr._4_4_ = glu::getProgramResourceUint(gl_00,dVar15,0x92e1,GVar14,0x9301);
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  bufMap.m_ptr._0_4_ = glu::getProgramResourceUint(gl_00,dVar15,0x92c0,bufMap.m_ptr._4_4_,0x9303);
  BufferMemMap::BufferMemMap((BufferMemMap *)local_5a0,gl_00,0x92c0,0,(deUint32)bufMap.m_ptr,1);
  pvVar24 = BufferMemMap::getPtr((BufferMemMap *)local_5a0);
  local_5a4 = *(uint *)((long)pvVar24 + (ulong)dVar13);
  if (local_5a4 != b) {
    blockSize_1._2_1_ = 1;
    pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&blockIndex_1,"Invalid atomic counter value",
               (allocator<char> *)((long)&blockSize_1 + 3));
    tcu::TestError::TestError(pTVar22,(string *)&blockIndex_1);
    blockSize_1._2_1_ = 0;
    __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  BufferMemMap::~BufferMemMap((BufferMemMap *)local_5a0);
  p_Var7 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  GVar14 = (*p_Var7)(dVar13,0x92e6,"Output");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  iVar12 = glu::getProgramResourceInt(gl_00,dVar13,0x92e6,GVar14,0x9303);
  p_Var7 = gl_00->getProgramResourceIndex;
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  GVar14 = (*p_Var7)(dVar13,0x92e5,"Output.values");
  dVar13 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2b0);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&bufMap_1.m_ptr,gl_00,dVar13,0x92e5,GVar14);
  BufferMemMap::BufferMemMap((BufferMemMap *)&refSum,gl_00,0x90d2,0,iVar12,1);
  valNdx = 0;
  res = 0;
  local_64c = 0;
  while( true ) {
    if ((int)b <= local_64c) {
      if (valNdx != res) {
        pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_700,"Total sum of values in Output.values doesn\'t match",
                   &local_701);
        tcu::TestError::TestError(pTVar22,&local_700);
        __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      BufferMemMap::~BufferMemMap((BufferMemMap *)&refSum);
      glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&bufMap_1.m_ptr);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2b0);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&program.m_program.m_info.linkTimeUs);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)local_48);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)
                 &counterBuffer.super_ObjectWrapper.m_object);
      return STOP;
    }
    pvVar24 = BufferMemMap::getPtr((BufferMemMap *)&refSum);
    local_650 = *(uint *)((long)pvVar24 +
                         (long)(int)(valueInfo.arraySize * local_64c) + (ulong)valueInfo.type);
    valNdx = valNdx + local_650;
    res = res + local_64c;
    bVar11 = de::inBounds<unsigned_int>(local_650,0,b);
    if (!bVar11) break;
    local_64c = local_64c + 1;
  }
  local_6d9 = 1;
  pTVar22 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"Comparison failed for Output.values[",&local_6b1);
  de::toString<int>(&local_6d8,&local_64c);
  std::operator+(&local_690,&local_6b0,&local_6d8);
  std::operator+(&local_670,&local_690,"]");
  tcu::TestError::TestError(pTVar22,&local_670);
  local_6d9 = 0;
  __cxa_throw(pTVar22,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const Buffer				counterBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "layout(binding = 0, offset = 0) uniform atomic_uint u_count;\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
			<< "\n"
			<< "    uint oldVal = atomicCounterIncrement(u_count);\n"
			<< "    sb_out.values[globalOffs+localOffs] = oldVal;\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Atomic counter buffer setup
		{
			const deUint32	uniformIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_count");
			const deUint32	bufferIndex		= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_ATOMIC_COUNTER_BUFFER_INDEX);
			const deUint32	bufferSize		= getProgramResourceUint(gl, program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, *counterBuffer);
			gl.bufferData(GL_ATOMIC_COUNTER_BUFFER, bufferSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap memMap(gl, GL_ATOMIC_COUNTER_BUFFER, 0, bufferSize, GL_MAP_WRITE_BIT);
				deMemset(memMap.getPtr(), 0, (int)bufferSize);
			}

			gl.bindBufferBase(GL_ATOMIC_COUNTER_BUFFER, 0, *counterBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Atomic counter buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare atomic counter
		{
			const deUint32		uniformIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_UNIFORM, "u_count");
			const deUint32		uniformOffset	= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_OFFSET);
			const deUint32		bufferIndex		= getProgramResourceUint(gl, program.getProgram(), GL_UNIFORM, uniformIndex, GL_ATOMIC_COUNTER_BUFFER_INDEX);
			const deUint32		bufferSize		= getProgramResourceUint(gl, program.getProgram(), GL_ATOMIC_COUNTER_BUFFER, bufferIndex, GL_BUFFER_DATA_SIZE);
			const BufferMemMap	bufMap			(gl, GL_ATOMIC_COUNTER_BUFFER, 0, bufferSize, GL_MAP_READ_BIT);

			const deUint32		resVal			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + uniformOffset));

			if (resVal != (deUint32)numValues)
				throw tcu::TestError("Invalid atomic counter value");
		}

		// Read back and compare SSBO
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);
			deUint32					valSum		= 0;
			deUint32					refSum		= 0;

			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const deUint32 res = *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*valNdx));

				valSum += res;
				refSum += (deUint32)valNdx;

				if (!de::inBounds<deUint32>(res, 0, (deUint32)numValues))
					throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(valNdx) + "]");
			}

			if (valSum != refSum)
				throw tcu::TestError("Total sum of values in Output.values doesn't match");
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}